

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifinpdlg(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  runcxdef *prVar5;
  runsdef *prVar6;
  int default_index;
  long lVar7;
  int cancel_index;
  int button_count;
  byte *pbVar8;
  ulong uVar9;
  uint len;
  char *labels [10];
  char prompt [256];
  char lblbuf [256];
  uint local_29c;
  ushort *local_298;
  long local_290;
  char *local_288 [10];
  byte local_238 [256];
  byte local_138 [264];
  
  prVar6 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar6 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar6[-1].runstyp == '\x01') {
    prVar6 = prVar5->runcxsp;
    lVar7 = (prVar6->runsv).runsvnum;
    prVar5->runcxsp = prVar6 + -1;
    if (prVar6[-1].runstyp != '\x03') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    local_298 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
    pbVar8 = local_238;
    bifcstr(ctx,(char *)pbVar8,0x100,(uchar *)local_298);
    for (; (ulong)*pbVar8 != 0; pbVar8 = pbVar8 + 1) {
      *pbVar8 = G_cmap_output[*pbVar8];
    }
    prVar6 = ctx->bifcxrun->runcxsp;
    uVar1 = prVar6[-1].runstyp;
    ctx->bifcxrun->runcxsp = prVar6 + -1;
    prVar5 = ctx->bifcxrun;
    if (uVar1 == '\x01') {
      if (prVar6[-1].runstyp != '\x01') goto LAB_00126307;
      prVar6 = prVar5->runcxsp;
      iVar2 = *(int *)&prVar6->runsv;
      button_count = 0;
    }
    else {
      local_290 = lVar7;
      if (prVar6[-1].runstyp != '\a') {
        prVar5->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3fc);
      }
      local_298 = (ushort *)(prVar5->runcxsp->runsv).runsvstr;
      local_29c = (uint)*local_298;
      local_298 = local_298 + 1;
      uVar9 = 0;
      lVar7 = 0;
      while (local_29c != 0) {
        pbVar8 = local_138 + lVar7;
        if ((char)*local_298 == '\x01') {
          if (*(int *)((long)local_298 + 1) - 1U < 4) {
            iVar2 = os_get_str_rsc(*(int *)((long)local_298 + 1),(char *)pbVar8,0x100 - lVar7);
            if (iVar2 == 0) goto LAB_0012622c;
          }
        }
        else if ((char)*local_298 == '\x03') {
          bifcstr(ctx,(char *)pbVar8,0x100 - lVar7,(uchar *)((long)local_298 + 1));
          for (pbVar3 = pbVar8; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
            *pbVar3 = G_cmap_output[*pbVar3];
          }
LAB_0012622c:
          local_288[uVar9] = (char *)pbVar8;
          uVar9 = uVar9 + 1;
          sVar4 = strlen((char *)pbVar8);
          lVar7 = lVar7 + sVar4 + 1;
        }
        if ((9 < uVar9) || (0xff < lVar7)) break;
        lstadv((uchar **)&local_298,&local_29c);
      }
      button_count = (int)uVar9;
      prVar5 = ctx->bifcxrun;
      prVar6 = prVar5->runcxsp;
      iVar2 = 0;
      lVar7 = local_290;
    }
    uVar1 = prVar6[-1].runstyp;
    prVar5->runcxsp = prVar6 + -1;
    if (uVar1 == '\x05') {
      prVar5 = ctx->bifcxrun;
      prVar6 = prVar5->runcxsp;
      default_index = 0;
    }
    else {
      prVar5 = ctx->bifcxrun;
      if (prVar6[-1].runstyp != '\x01') goto LAB_00126307;
      prVar6 = prVar5->runcxsp;
      default_index = *(int *)&prVar6->runsv;
    }
    cancel_index = 0;
    uVar1 = prVar6[-1].runstyp;
    prVar5->runcxsp = prVar6 + -1;
    if (uVar1 != '\x05') {
      prVar5 = ctx->bifcxrun;
      if (prVar6[-1].runstyp != '\x01') goto LAB_00126307;
      cancel_index = *(int *)&prVar5->runcxsp->runsv;
    }
    outflushn(0);
    iVar2 = tio_input_dialog((int)lVar7,(char *)local_238,iVar2,local_288,button_count,default_index
                             ,cancel_index);
    runpnum(ctx->bifcxrun,(long)iVar2);
    return;
  }
LAB_00126307:
  prVar5->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void bifinpdlg(bifcxdef *ctx, int argc)
{
    uchar *p;
    char prompt[256];
    char lblbuf[256];
    char *labels[10];
    char *dst;
    char *xp;
    uint len;
    size_t bcnt;
    int default_resp, cancel_resp;
    int resp;
    int std_btns;
    int icon_id;

    /* check for proper arguments */
    bifcntargs(ctx, 5, argc);

    /* get the icon number */
    icon_id = runpopnum(ctx->bifcxrun);

    /* get the prompt string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, prompt, (size_t)sizeof(prompt), p);

    /* translate from internal to local characters */
    for (xp = prompt ; *xp != '\0' ; xp++)
        *xp = (char)cmap_i2n(*xp);

    /* check for a standard button set selection */
    if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        /* get the standard button set ID */
        std_btns = runpopnum(ctx->bifcxrun);

        /* there are no actual buttons */
        bcnt = 0;
    }
    else
    {
        /* we're not using standard buttons */
        std_btns = 0;
        
        /* get the response string list */
        p = runpoplst(ctx->bifcxrun);
        len = osrp2(p);
        p += 2;
        
        /* build our internal button list */
        for (bcnt = 0, dst = lblbuf ; len != 0 ; lstadv(&p, &len))
        {
            /* see what we have */
            if (*p == DAT_SSTRING)
            {
                /* it's a label string - convert to a C string */
                bifcstr(ctx, dst, sizeof(lblbuf) - (dst - lblbuf), p + 1);

                /* translate from internal to local characters */
                for (xp = dst ; *xp != '\0' ; xp++)
                    *xp = (char)cmap_i2n(*xp);
                
                /* set this button to point to the converted text */
                labels[bcnt++] = dst;
                
                /* move past this label in the button buffer */
                dst += strlen(dst) + 1;
            }
            else if (*p == DAT_NUMBER)
            {
                int id;
                int resid;
                
                /* it's a standard system label ID - get the ID */
                id = (int)osrp4s(p + 1);

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = RESID_BTN_OK;
                    break;
                    
                case BIFINPDLG_LBL_CANCEL:
                    resid = RESID_BTN_CANCEL;
                    break;
                    
                case BIFINPDLG_LBL_YES:
                    resid = RESID_BTN_YES;
                    break;
                    
                case BIFINPDLG_LBL_NO:
                    resid = RESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, dst,
                                       sizeof(lblbuf) - (dst - lblbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[bcnt++] = dst;

                    /* move past this label in the button buffer */
                    dst += strlen(dst) + 1;
                }
            }
            
            /* if we have exhausted our label array, stop now */
            if (bcnt >= sizeof(labels)/sizeof(labels[0])
                || dst >= lblbuf + sizeof(lblbuf))
                break;
        }
    }

    /* get the default response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        default_resp = 0;
    }
    else
        default_resp = runpopnum(ctx->bifcxrun);

    /* get the cancel response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        cancel_resp = 0;
    }
    else
        cancel_resp = runpopnum(ctx->bifcxrun);

    /* flush output before showing the dialog */
    tioflushn(ctx->bifcxtio, 0);

    /* show the dialog */
    resp = tio_input_dialog(icon_id, prompt, std_btns,
                            (const char **)labels, bcnt,
                            default_resp, cancel_resp);

    /* return the result */
    runpnum(ctx->bifcxrun, resp);
}